

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_joinref.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundJoinRef *ref)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_01;
  pointer *this_02;
  undefined1 uVar1;
  char cVar2;
  JoinType type;
  JoinRefType reftype;
  LogicalOperatorType LVar3;
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> context;
  _func_int **pp_Var4;
  pointer puVar5;
  pointer puVar6;
  long lVar7;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar8;
  LogicalOperator *pLVar9;
  undefined1 auVar10 [8];
  undefined8 uVar11;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var12;
  bool bVar13;
  int iVar14;
  type pLVar15;
  ClientConfig *pCVar16;
  pointer pEVar17;
  pointer pLVar18;
  Binder *pBVar19;
  LogicalFilter *pLVar20;
  reference pvVar21;
  reference pvVar22;
  type expression_00;
  element_type *this_03;
  pointer pLVar23;
  LogicalAnyJoin *pLVar24;
  NotImplementedException *this_04;
  ClientContext *in_RDX;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  pointer puVar25;
  size_type __n;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var26;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this_05;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_06;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression;
  optional_ptr<duckdb::LogicalOperator,_true> join;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> right;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *result;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> left;
  templated_unique_single_t filter;
  RecursiveDependentJoinPlanner plan;
  undefined1 local_e8 [8];
  undefined1 local_e0 [32];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer local_98;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_90;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  __node_base local_80;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_78;
  long *local_70;
  __node_base local_68;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_50;
  __node_base local_48;
  element_type *local_40;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_38;
  
  uVar1 = *(undefined1 *)
           ((long)&ref[3].correlated_columns.
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   .
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
  if (*(char *)((long)&(in_RDX->config).profiler_save_location._M_string_length + 3) == '\x01') {
    *(undefined1 *)
     ((long)&ref[3].correlated_columns.
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  }
  local_e0._8_8_ = this;
  local_e0._16_8_ = in_RDX;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             &in_RDX->config);
  CreatePlan((Binder *)(local_e0 + 0x18),&ref->super_BoundTableRef);
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             &(in_RDX->config).home_directory._M_string_length);
  CreatePlan((Binder *)local_e0,&ref->super_BoundTableRef);
  *(undefined1 *)
   ((long)&ref[3].correlated_columns.
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = uVar1;
  if ((*(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                        _M_string_length + 3) == '\0') &&
     ((((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).field_2.
      _M_allocated_capacity !=
      *(size_type *)
       ((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).field_2 + 8))) {
    pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_e0);
    LateralBinder::ReduceExpressionDepth
              (pLVar15,(vector<duckdb::CorrelatedColumnInfo,_true> *)
                       &(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).field_2
              );
  }
  if ((((*(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                          _M_string_length + 1) == '\x02') &&
       (*(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                         _M_string_length + 2) != '\x04')) &&
      (pCVar16 = ClientConfig::GetConfig
                           ((ClientContext *)
                            (ref->super_BoundTableRef).sample.
                            super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                            .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl),
      pCVar16->enable_optimizer == true)) &&
     (bVar13 = Optimizer::OptimizerDisabled
                         ((ClientContext *)
                          (ref->super_BoundTableRef).sample.
                          super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                          .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl,
                          BUILD_SIDE_PROBE_SIDE), uVar11 = local_e0._24_8_, !bVar13)) {
    *(undefined1 *)
     ((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location)._M_string_length +
     1) = 1;
    local_e0._24_8_ = local_e0._0_8_;
    local_e0._0_8_ = uVar11;
  }
  if (*(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                       _M_string_length + 3) == '\x01') {
    local_38._M_head_impl = (LogicalOperator *)local_e0._24_8_;
    local_e0._24_8_ = (pointer)0x0;
    local_40 = (element_type *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._1_7_ = 0;
    condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ =
         *(byte *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                          _M_string_length + 1);
    local_70 = (long *)(((ClientConfig *)(local_e0._16_8_ + 0x38))->home_directory).field_2.
                       _M_allocated_capacity;
    (((ClientConfig *)(local_e0._16_8_ + 0x38))->home_directory).field_2._M_allocated_capacity = 0;
    PlanLateralJoin((Binder *)local_e0._8_8_,
                    (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     *)ref,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_38,(vector<duckdb::CorrelatedColumnInfo,_true> *)&local_40,
                    (char)local_e0._16_8_ + 0x70,condition);
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
    if (local_40 != (element_type *)0x0) {
      (*(code *)(((local_40->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_40 = (element_type *)0x0;
    if ((element_type *)local_38._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                              &(local_38._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                             internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> +
                  8))();
    }
    local_38._M_head_impl = (LogicalOperator *)0x0;
    if (*(char *)&ref[3].correlated_columns.
                  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  .
                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != '\x01') goto LAB_00e0893f;
    local_b8._0_8_ = &PTR__RecursiveDependentJoinPlanner_02480cc8;
    local_b8._8_8_ =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
    local_a8._M_allocated_capacity = (size_type)ref;
    pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_e0._8_8_);
    RecursiveDependentJoinPlanner::VisitOperator((RecursiveDependentJoinPlanner *)local_b8,pLVar15);
    local_b8._0_8_ = &PTR__RecursiveDependentJoinPlanner_02480cc8;
    _Var26.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_b8._8_8_;
LAB_00e0837d:
    if (_Var26.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var26.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
    goto LAB_00e0893f;
  }
  cVar2 = *(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                           _M_string_length + 2);
  if (cVar2 == '\x03') {
    local_50._M_head_impl = (LogicalOperator *)local_e0._24_8_;
    local_e0._24_8_ = (pointer)0x0;
    local_80._M_nxt = (_Hash_node_base *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalPositionalJoin::Create
              ((LogicalPositionalJoin *)local_e0._8_8_,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_50,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_80);
    if ((element_type *)local_80._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_80._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_80._M_nxt = (_Hash_node_base *)0x0;
    if ((element_type *)local_50._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_50._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_50._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00e0893f;
  }
  if (cVar2 == '\x02') {
    local_48._M_nxt = (_Hash_node_base *)local_e0._24_8_;
    local_e0._24_8_ = (pointer)0x0;
    local_78._M_head_impl = (LogicalOperator *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)local_e0._8_8_,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_48,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_78);
    if ((element_type *)local_78._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_78._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_78._M_head_impl = (LogicalOperator *)0x0;
    if ((element_type *)local_48._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_48._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_48._M_nxt = (_Hash_node_base *)0x0;
    goto LAB_00e0893f;
  }
  if (*(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                       _M_string_length + 1) == '\x03') {
    this_00 = &(((ClientConfig *)(local_e0._16_8_ + 0x38))->home_directory).field_2;
    pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&this_00->_M_allocated_capacity);
    iVar14 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[4])(pEVar17);
    if ((char)iVar14 == '\0') {
      expression_00 =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&this_00->_M_allocated_capacity);
      bVar13 = HasCorrelatedColumns(expression_00);
      if (bVar13 && *(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->
                                     profiler_save_location)._M_string_length + 2) == '\0')
      goto LAB_00e0874f;
    }
    else if (*(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                              _M_string_length + 2) == '\0') {
LAB_00e0874f:
      local_58._M_head_impl = (LogicalOperator *)local_e0._24_8_;
      local_e0._24_8_ = (pointer)0x0;
      local_88._M_head_impl = (LogicalOperator *)local_e0._0_8_;
      local_e0._0_8_ =
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)local_e8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_58,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_88);
      if ((element_type *)local_88._M_head_impl != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_88._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      local_88._M_head_impl = (LogicalOperator *)0x0;
      if ((element_type *)local_58._M_head_impl != (element_type *)0x0) {
        (**(code **)((long)(((enable_shared_from_this<duckdb::Binder> *)
                            &(local_58._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal
                           .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8)
        )();
      }
      local_58._M_head_impl = (LogicalOperator *)0x0;
      this_03 = (element_type *)operator_new(0x80);
      local_b8._0_8_ = this_00->_M_allocated_capacity;
      this_00->_M_allocated_capacity = 0;
      LogicalFilter::LogicalFilter
                ((LogicalFilter *)this_03,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_b8);
      local_c0._M_head_impl = (LogicalOperator *)this_03;
      if ((_Hash_node_base *)local_b8._0_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_b8._0_8_)[1]._M_nxt)();
      }
      pLVar23 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&local_c0);
      puVar25 = (pLVar23->super_LogicalOperator).expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar6 = (pLVar23->super_LogicalOperator).expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar25 != puVar6) {
        do {
          PlanSubqueries((Binder *)ref,puVar25,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_e8);
          puVar25 = puVar25 + 1;
        } while (puVar25 != puVar6);
      }
      pLVar23 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&local_c0);
      local_90._M_head_impl = (LogicalOperator *)local_e8;
      local_e8 = (undefined1  [8])0x0;
      LogicalOperator::AddChild
                (&pLVar23->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_90);
      if (local_90._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_90._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      _Var12._M_head_impl = local_c0._M_head_impl;
      local_90._M_head_impl = (LogicalOperator *)0x0;
      local_c0._M_head_impl = (LogicalOperator *)0x0;
      (((enable_shared_from_this<duckdb::Binder> *)local_e0._8_8_)->__weak_this_).internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var12._M_head_impl;
      _Var26.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_e8;
      goto LAB_00e0837d;
    }
  }
  context._M_head_impl =
       (ref->super_BoundTableRef).sample.
       super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  type = *(JoinType *)
          ((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                  _M_string_length + 1);
  reftype = *(JoinRefType *)
             ((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                     _M_string_length + 2);
  local_60._M_head_impl = (LogicalOperator *)local_e0._24_8_;
  local_e0._24_8_ = (pointer)0x0;
  local_68._M_nxt = (_Hash_node_base *)local_e0._0_8_;
  local_e0._0_8_ =
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  local_98 = (pointer)(((ClientConfig *)(local_e0._16_8_ + 0x38))->home_directory).field_2.
                      _M_allocated_capacity;
  (((ClientConfig *)(local_e0._16_8_ + 0x38))->home_directory).field_2._M_allocated_capacity = 0;
  LogicalComparisonJoin::CreateJoin
            ((LogicalComparisonJoin *)local_e0._8_8_,(ClientContext *)context._M_head_impl,type,
             reftype,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&local_60,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_68,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
             &local_98);
  if (local_98 != (pointer)0x0) {
    (*(code *)(*(_Hash_node_base **)&local_98->id_)[1]._M_nxt)();
  }
  local_98 = (pointer)0x0;
  if ((element_type *)local_68._M_nxt != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_68._M_nxt)->_M_nxt)->
                __weak_this_).internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  local_68._M_nxt = (_Hash_node_base *)0x0;
  if ((element_type *)local_60._M_head_impl != (element_type *)0x0) {
    (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                            &(local_60._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal
                           .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))();
  }
  local_60._M_head_impl = (LogicalOperator *)0x0;
  local_e8 = (undefined1  [8])0x0;
  pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_e0._8_8_);
  pBVar19 = (Binder *)local_e0._8_8_;
  if (pLVar18->type == LOGICAL_FILTER) {
    pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_e0._8_8_);
    pBVar19 = (Binder *)
              vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&pLVar18->children,0);
  }
  local_e8 = (undefined1  [8])
             (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                *)&(pBVar19->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                   super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl;
  if (*(char *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location).
                       _M_string_length + 1) == '\a') {
    pp_Var4 = (_func_int **)
              (((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_settings)._M_h._M_bucket_count;
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    ((LogicalOperator *)((long)local_e8 + 0x68))->_vptr_LogicalOperator = pp_Var4;
  }
  optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
            ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
  puVar5 = (((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              *)((long)local_e8 + 0x10))->
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_05 = (((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    *)((long)local_e8 + 0x10))->
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_05 != puVar5; this_05 = this_05 + 1
      ) {
    pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(this_05);
    if (pLVar18->type == LOGICAL_FILTER) {
      pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(this_05);
      pLVar20 = LogicalOperator::Cast<duckdb::LogicalFilter>(pLVar18);
      puVar25 = (pLVar20->super_LogicalOperator).expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar6 = (pLVar20->super_LogicalOperator).expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar25 != puVar6) {
        do {
          pvVar21 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](&(pLVar20->super_LogicalOperator).children,0);
          PlanSubqueries((Binder *)ref,puVar25,pvVar21);
          puVar25 = puVar25 + 1;
        } while (puVar25 != puVar6);
      }
    }
  }
  optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
            ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
  LVar3 = *(LogicalOperatorType *)((long)local_e8 + 8);
  if (LVar3 == LOGICAL_COMPARISON_JOIN) {
LAB_00e0867a:
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    auVar10 = local_e8;
    if ((pointer)((LogicalOperator *)((long)local_e8 + 0x68))->estimated_cardinality !=
        (((LogicalOperator *)((long)local_e8 + 0x68))->types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      this_02 = &(((LogicalOperator *)((long)local_e8 + 0x68))->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      this_01 = (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 *)((long)local_e8 + 0x10);
      __n = 0;
      do {
        pvVar22 = vector<duckdb::JoinCondition,_true>::operator[]
                            ((vector<duckdb::JoinCondition,_true> *)this_02,__n);
        pvVar21 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::operator[](this_01,0);
        PlanSubqueries((Binder *)ref,&pvVar22->left,pvVar21);
        pvVar22 = vector<duckdb::JoinCondition,_true>::operator[]
                            ((vector<duckdb::JoinCondition,_true> *)this_02,__n);
        pvVar21 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::operator[](this_01,1);
        PlanSubqueries((Binder *)ref,&pvVar22->right,pvVar21);
        __n = __n + 1;
      } while (__n < (ulong)(((long)(((LogicalOperator *)((long)auVar10 + 0x68))->
                                     estimated_cardinality -
                                    (long)(((LogicalOperator *)((long)auVar10 + 0x68))->types).
                                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          .
                                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage) >> 3)
                            * -0x5555555555555555));
    }
  }
  else if (LVar3 == LOGICAL_ANY_JOIN) {
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    pLVar24 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>((LogicalOperator *)local_e8);
    pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pLVar24->condition);
    iVar14 = (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[4])(pEVar17);
    if ((char)iVar14 != '\0') {
      this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Cannot perform non-inner join on subquery!","");
      NotImplementedException::NotImplementedException(this_04,(string *)local_b8);
      __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (LVar3 == LOGICAL_ASOF_JOIN) goto LAB_00e0867a;
  pCVar16 = (ClientConfig *)(local_e0._16_8_ + 0x38);
  lVar7._0_1_ = pCVar16->enable_profiler;
  lVar7._1_1_ = pCVar16->enable_detailed_profiling;
  lVar7._2_1_ = pCVar16->profiler_print_format;
  lVar7._3_5_ = *(undefined5 *)&pCVar16->field_0x23;
  if (*(long *)((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->home_directory).field_2 + 8) !=
      lVar7) {
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    *(LogicalOperatorType *)((long)local_e8 + 8) = LOGICAL_DELIM_JOIN;
    *(char *)&(((LogicalOperator *)((long)local_e8 + 0xd0))->expressions).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
         (char)(((ClientConfig *)(local_e0._16_8_ + 0x38))->profiler_save_location)._M_string_length
    ;
    this_06 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
               ((long)&(((ClientConfig *)(local_e0._16_8_ + 0x38))->home_directory).field_2 + 8);
    puVar8 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
              &((ClientConfig *)(local_e0._16_8_ + 0x38))->enable_profiler;
    if (this_06 != puVar8) {
      pLVar9 = (LogicalOperator *)((long)local_e8 + 0xd0);
      do {
        pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_06);
        (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[0x11])
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_b8,pEVar17);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&(pLVar9->children).
                       super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_b8);
        if ((_Hash_node_base *)local_b8._0_8_ != (_Hash_node_base *)0x0) {
          (*(code *)(*(_Hash_node_base **)local_b8._0_8_)[1]._M_nxt)();
        }
        this_06 = this_06 + 1;
      } while (this_06 != puVar8);
    }
  }
LAB_00e0893f:
  if ((LogicalOperator *)local_e0._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_e0._0_8_ + 8))();
  }
  if ((pointer)local_e0._24_8_ != (pointer)0x0) {
    (*(code *)*(_Hash_node_base **)
               &((((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    *)local_e0._24_8_)->_M_t).
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->type)();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )local_e0._8_8_;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundJoinRef &ref) {
	auto old_is_outside_flattened = is_outside_flattened;
	// Plan laterals from outermost to innermost
	if (ref.lateral) {
		// Set the flag to ensure that children do not flatten before the root
		is_outside_flattened = false;
	}
	auto left = CreatePlan(*ref.left);
	auto right = CreatePlan(*ref.right);
	is_outside_flattened = old_is_outside_flattened;

	// For joins, depth of the bindings will be one higher on the right because of the lateral binder
	// If the current join does not have correlations between left and right, then the right bindings
	// have depth 1 too high and can be reduced by 1 throughout
	if (!ref.lateral && !ref.correlated_columns.empty()) {
		LateralBinder::ReduceExpressionDepth(*right, ref.correlated_columns);
	}

	if (ref.type == JoinType::RIGHT && ref.ref_type != JoinRefType::ASOF &&
	    ClientConfig::GetConfig(context).enable_optimizer &&
	    !Optimizer::OptimizerDisabled(context, OptimizerType::BUILD_SIDE_PROBE_SIDE)) {
		// we turn any right outer joins into left outer joins for optimization purposes
		// they are the same but with sides flipped, so treating them the same simplifies life
		ref.type = JoinType::LEFT;
		std::swap(left, right);
	}
	if (ref.lateral) {
		auto new_plan = PlanLateralJoin(std::move(left), std::move(right), ref.correlated_columns, ref.type,
		                                std::move(ref.condition));
		if (has_unplanned_dependent_joins) {
			RecursiveDependentJoinPlanner plan(*this);
			plan.VisitOperator(*new_plan);
		}
		return new_plan;
	}
	switch (ref.ref_type) {
	case JoinRefType::CROSS:
		return LogicalCrossProduct::Create(std::move(left), std::move(right));
	case JoinRefType::POSITIONAL:
		return LogicalPositionalJoin::Create(std::move(left), std::move(right));
	default:
		break;
	}
	if (ref.type == JoinType::INNER && (ref.condition->HasSubquery() || HasCorrelatedColumns(*ref.condition)) &&
	    ref.ref_type == JoinRefType::REGULAR) {
		// inner join, generate a cross product + filter
		// this will be later turned into a proper join by the join order optimizer
		auto root = LogicalCrossProduct::Create(std::move(left), std::move(right));

		auto filter = make_uniq<LogicalFilter>(std::move(ref.condition));
		// visit the expressions in the filter
		for (auto &expression : filter->expressions) {
			PlanSubqueries(expression, root);
		}
		filter->AddChild(std::move(root));
		return std::move(filter);
	}

	// now create the join operator from the join condition
	auto result = LogicalComparisonJoin::CreateJoin(context, ref.type, ref.ref_type, std::move(left), std::move(right),
	                                                std::move(ref.condition));
	optional_ptr<LogicalOperator> join;
	if (result->type == LogicalOperatorType::LOGICAL_FILTER) {
		join = result->children[0].get();
	} else {
		join = result.get();
	}

	if (ref.type == JoinType::MARK) {
		join->Cast<LogicalJoin>().mark_index = ref.mark_index;
	}
	for (auto &child : join->children) {
		if (child->type == LogicalOperatorType::LOGICAL_FILTER) {
			auto &filter = child->Cast<LogicalFilter>();
			for (auto &expr : filter.expressions) {
				PlanSubqueries(expr, filter.children[0]);
			}
		}
	}

	// we visit the expressions depending on the type of join
	switch (join->type) {
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		// comparison join
		// in this join we visit the expressions on the LHS with the LHS as root node
		// and the expressions on the RHS with the RHS as root node
		auto &comp_join = join->Cast<LogicalComparisonJoin>();
		for (idx_t i = 0; i < comp_join.conditions.size(); i++) {
			PlanSubqueries(comp_join.conditions[i].left, comp_join.children[0]);
			PlanSubqueries(comp_join.conditions[i].right, comp_join.children[1]);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_ANY_JOIN: {
		auto &any_join = join->Cast<LogicalAnyJoin>();
		// for the any join we just visit the condition
		if (any_join.condition->HasSubquery()) {
			throw NotImplementedException("Cannot perform non-inner join on subquery!");
		}
		break;
	}
	default:
		break;
	}
	if (!ref.duplicate_eliminated_columns.empty()) {
		auto &comp_join = join->Cast<LogicalComparisonJoin>();
		comp_join.type = LogicalOperatorType::LOGICAL_DELIM_JOIN;
		comp_join.delim_flipped = ref.delim_flipped;
		for (auto &col : ref.duplicate_eliminated_columns) {
			comp_join.duplicate_eliminated_columns.emplace_back(col->Copy());
		}
	}
	return result;
}